

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
new_datatype_matrix(Context_conflict *ctx,MOJOSHADER_astDataType *dt,int rows,int columns)

{
  int iVar1;
  Context_conflict *local_30;
  MOJOSHADER_astDataType *retval;
  int columns_local;
  int rows_local;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  retval._0_4_ = columns;
  retval._4_4_ = rows;
  _columns_local = dt;
  dt_local = (MOJOSHADER_astDataType *)ctx;
  local_30 = (Context_conflict *)Malloc(ctx,0x20);
  if (local_30 == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    iVar1 = buffer_append(*(Buffer **)((long)dt_local + 0x3b8),&local_30,8);
    if (iVar1 == 0) {
      Free((Context_conflict *)&dt_local->array,local_30);
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      if ((retval._4_4_ < 1) || (4 < retval._4_4_)) {
        fail((Context_conflict *)&dt_local->array,"Matrix must have between 1 and 4 rows");
      }
      if (((int)retval < 1) || (4 < (int)retval)) {
        fail((Context_conflict *)&dt_local->array,"Matrix must have between 1 and 4 columns");
      }
      local_30->isfail = 0x13;
      local_30->malloc = (MOJOSHADER_malloc)_columns_local;
      *(int *)&local_30->free = retval._4_4_;
      *(int *)((long)&local_30->free + 4) = (int)retval;
      ctx_local = local_30;
    }
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *new_datatype_matrix(Context *ctx,
                                            const MOJOSHADER_astDataType *dt,
                                            const int rows, const int columns)
{
    MOJOSHADER_astDataType *retval;
    // !!! FIXME: allocate enough for a matrix, but we need to cleanup things that copy without checking for subsize.
    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    // !!! FIXME:  I'd like to cache these anyhow and reuse types.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if ((rows < 1) || (rows > 4))
        fail(ctx, "Matrix must have between 1 and 4 rows");
    if ((columns < 1) || (columns > 4))
        fail(ctx, "Matrix must have between 1 and 4 columns");

    retval->type = MOJOSHADER_AST_DATATYPE_MATRIX;
    retval->matrix.base = dt;
    retval->matrix.rows = rows;
    retval->matrix.columns = columns;
    return retval;
}